

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafill.c
# Opt level: O2

int main(int argc,char **argv)

{
  nva_card *pnVar1;
  int iVar2;
  char *__ptr;
  size_t sStack_50;
  int32_t v;
  int32_t b;
  int cnum;
  int32_t a;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    cnum = 0;
    do {
      while (iVar2 = getopt(argc,argv,"c:"), iVar2 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar2 != -1);
    if (cnum < nva_cardsnum) {
      v = 0;
      b = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
        }
        if (_optind + 2 < argc) {
          __isoc99_sscanf(argv[_optind + 2],"%x",&v);
        }
        pnVar1 = nva_cards;
        for (iVar2 = 0; iVar2 < b; iVar2 = iVar2 + 4) {
          *(int32_t *)((long)pnVar1[cnum].bar0 + (ulong)(uint)(a + iVar2)) = v + iVar2;
        }
        return 0;
      }
      __ptr = "No address specified.\n";
      sStack_50 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_50 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_50 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_50 = 0x12;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, v = 0, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	if (optind + 2 < argc)
		sscanf (argv[optind + 2], "%x", &v);
	for (i = 0; i < b; i += 4) {
		nva_wr32(cnum, a+i, v+i);
	}
	return 0;
}